

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

ON_Color __thiscall ON_Layer::PerViewportPlotColor(ON_Layer *this,ON_UUID viewport_id)

{
  bool bVar1;
  uint uVar2;
  ON__LayerPerViewSettings *pOVar3;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar4;
  bool in_R9B;
  ON_Color *this_00;
  ON_UUID viewport_id_00;
  
  if ((this->m_extension_bits & 1) == 0) {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = viewport_id.Data4;
    pOVar3 = ON__LayerExtensions::ViewportSettings
                       ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                        viewport_id._0_8_,viewport_id_00,in_R9B);
    bVar1 = true;
    if (pOVar3 != (ON__LayerPerViewSettings *)0x0) {
      this_00 = &pOVar3->m_plot_color;
      uVar2 = ON_Color::operator_cast_to_unsigned_int(this_00);
      pOVar3 = (ON__LayerPerViewSettings *)(ulong)uVar2;
      if (uVar2 != 0xffffffff) {
        pOVar3 = (ON__LayerPerViewSettings *)(ulong)(this_00->field_0).m_color;
        bVar1 = false;
      }
    }
    if (!bVar1) {
      return (ON_Color)(uint)pOVar3;
    }
  }
  uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_plot_color);
  paVar4 = &(this->m_color).field_0;
  if (uVar2 != 0xffffffff) {
    paVar4 = &(this->m_plot_color).field_0;
  }
  return (ON_Color)*paVar4;
}

Assistant:

ON_Color ON_Layer::PerViewportPlotColor( ON_UUID viewport_id ) const
{
  if ( !ExtensionBit(m_extension_bits,0x01) )
  {
    const ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
    if ( 0 != vp_settings && vp_settings->m_plot_color != ON_UNSET_COLOR )
      return vp_settings->m_plot_color;
  }

  // no per viewport settings
  // 2-Nov-2009 Dale Fugier, modified to call default PlotColor()
  return PlotColor();
}